

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
userDefinedUnits_definitionStringsInputOnly_Test::~userDefinedUnits_definitionStringsInputOnly_Test
          (userDefinedUnits_definitionStringsInputOnly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(userDefinedUnits, definitionStringsInputOnly)
{
    precise_unit idgit(4.754, mol / m.pow(2));
    addUserDefinedInputUnit("idgit", idgit);

    auto ipm = unit_from_string("idgit/min");
    EXPECT_EQ(ipm, idgit / minute);

    auto str = to_string(ipm);
    /** input only should not result in any string result with the user defined
     * input*/
    EXPECT_EQ(str.find("idgit"), std::string::npos);
    clearUserDefinedUnits();
}